

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecache.c
# Opt level: O0

_Bool duckdb_je_ecache_init
                (tsdn_t *tsdn,ecache_t *ecache,extent_state_t state,uint ind,_Bool delay_coalesce)

{
  _Bool _Var1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  malloc_mutex_t *in_RSI;
  undefined1 in_R8B;
  malloc_mutex_lock_order_t in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  extent_state_t state_00;
  
  state_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffdc) & 0x1ffffff;
  _Var1 = duckdb_je_malloc_mutex_init
                    (in_RSI,(char *)CONCAT44(in_EDX,in_ECX),state_00,in_stack_ffffffffffffffd8);
  if (!_Var1) {
    *(undefined4 *)((long)&in_RSI[0xad].field_0 + 0x30) = in_EDX;
    *(undefined4 *)((long)&in_RSI[0xad].field_0 + 0x34) = in_ECX;
    *(byte *)((long)&in_RSI[0xad].field_0 + 0x38) = (byte)(state_00 >> 0x18) & 1;
    duckdb_je_eset_init((eset_t *)CONCAT44(in_EDX,in_ECX),state_00);
    duckdb_je_eset_init((eset_t *)CONCAT44(in_EDX,in_ECX),state_00);
  }
  return _Var1;
}

Assistant:

bool
ecache_init(tsdn_t *tsdn, ecache_t *ecache, extent_state_t state, unsigned ind,
    bool delay_coalesce) {
	if (malloc_mutex_init(&ecache->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	ecache->state = state;
	ecache->ind = ind;
	ecache->delay_coalesce = delay_coalesce;
	eset_init(&ecache->eset, state);
	eset_init(&ecache->guarded_eset, state);

	return false;
}